

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldf_process.cpp
# Opt level: O2

void __thiscall ldf::print(ldf *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  p_Var2 = (this->layer_definition)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  poVar1 = std::operator<<((ostream *)&std::cout,"Printing layer definition information.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"================= Start ================");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (; (_Rb_tree_header *)p_Var2 != &(this->layer_definition)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Layer number = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var2[1]._M_color);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Name         = ");
    poVar1 = std::operator<<(poVar1,(string *)&p_Var2[1]._M_parent);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Thickness    = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&p_Var2[2]._M_parent);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Order        = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&p_Var2[2]._M_parent + 4));
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Mask         = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&p_Var2[2]._M_left);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Film type    = ");
    poVar1 = std::operator<<(poVar1,*(char *)((long)&p_Var2[2]._M_left + 4));
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Colour       = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&p_Var2[2]._M_right);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"----------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"================== End =================");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ldf::print()
{
  auto it = layer_definition.begin();
  cout << "Printing layer definition information." << endl;
  cout << "================= Start ================" << endl;
  while (it != layer_definition.end()) {
    cout << "Layer number = " << it->first << endl;
    cout << "Name         = " << it->second.name << endl;
    cout << "Thickness    = " << it->second.thickness << endl;
    cout << "Order        = " << it->second.order << endl;
    cout << "Mask         = " << it->second.mask << endl;
    cout << "Film type    = " << it->second.film_type << endl;
    cout << "Colour       = " << it->second.colour << endl;
    cout << "----------------------------------------" << endl;
    it++;
  }
  cout << "================== End =================" << endl;
}